

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O1

void glfwWindowHintString(int hint,char *value)

{
  long lVar1;
  
  if (value == (char *)0x0) {
    __assert_fail("value != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/sonoro1234[P]LuaJIT-GLFW/GLFW/src/window.c"
                  ,0x1b9,"void glfwWindowHintString(int, const char *)");
  }
  if (_glfw.initialized == 0) {
    _glfwInputError(0x10001,(char *)0x0);
    return;
  }
  if (hint < 0x24002) {
    if (hint == 0x23002) {
      lVar1 = 800;
    }
    else {
      if (hint != 0x24001) {
LAB_00114a03:
        _glfwInputError(0x10003,"Invalid window hint string 0x%08X");
        return;
      }
      lVar1 = 0x420;
    }
  }
  else if (hint == 0x24002) {
    lVar1 = 0x520;
  }
  else {
    if (hint != 0x26001) goto LAB_00114a03;
    lVar1 = 0x628;
  }
  strncpy((char *)((long)&_glfw.initialized + lVar1),value,0xff);
  return;
}

Assistant:

GLFWAPI void glfwWindowHintString(int hint, const char* value)
{
    assert(value != NULL);

    _GLFW_REQUIRE_INIT();

    switch (hint)
    {
        case GLFW_COCOA_FRAME_NAME:
            strncpy(_glfw.hints.window.ns.frameName, value,
                    sizeof(_glfw.hints.window.ns.frameName) - 1);
            return;
        case GLFW_X11_CLASS_NAME:
            strncpy(_glfw.hints.window.x11.className, value,
                    sizeof(_glfw.hints.window.x11.className) - 1);
            return;
        case GLFW_X11_INSTANCE_NAME:
            strncpy(_glfw.hints.window.x11.instanceName, value,
                    sizeof(_glfw.hints.window.x11.instanceName) - 1);
            return;
        case GLFW_WAYLAND_APP_ID:
            strncpy(_glfw.hints.window.wl.appId, value,
                    sizeof(_glfw.hints.window.wl.appId) - 1);
            return;
    }

    _glfwInputError(GLFW_INVALID_ENUM, "Invalid window hint string 0x%08X", hint);
}